

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_histogram.c
# Opt level: O2

REF_STATUS ref_histogram_add_ratio(REF_HISTOGRAM ref_histogram,REF_GRID ref_grid)

{
  REF_DBL *pRVar1;
  uint uVar2;
  undefined8 uVar3;
  char *pcVar4;
  long lVar5;
  REF_INT part;
  REF_EDGE ref_edge;
  REF_DBL ratio;
  int local_44;
  REF_EDGE local_40;
  REF_DBL local_38;
  
  uVar2 = ref_edge_create(&local_40,ref_grid);
  if (uVar2 == 0) {
    for (lVar5 = 0; lVar5 < local_40->n; lVar5 = lVar5 + 1) {
      uVar2 = ref_edge_part(local_40,(REF_INT)lVar5,&local_44);
      if (uVar2 != 0) {
        pcVar4 = "edge part";
        uVar3 = 0x184;
        goto LAB_0017bff3;
      }
      if (local_44 == ref_grid->mpi->id) {
        uVar2 = ref_node_ratio(ref_grid->node,local_40->e2n[lVar5 * 2],local_40->e2n[lVar5 * 2 + 1],
                               &local_38);
        if (uVar2 != 0) {
          pcVar4 = "rat";
          uVar3 = 0x189;
          goto LAB_0017bff3;
        }
        uVar2 = ref_histogram_add(ref_histogram,local_38);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c"
                 ,0x192,"ref_histogram_add_ratio",(ulong)uVar2,"add");
          pRVar1 = ref_grid->node->real;
          lVar5 = (long)local_40->e2n[lVar5 * 2];
          printf("ratio %e at %f %f %f\n",local_38,pRVar1[lVar5 * 0xf],pRVar1[lVar5 * 0xf + 1],
                 pRVar1[lVar5 * 0xf + 2]);
          return uVar2;
        }
      }
    }
    uVar2 = ref_histogram_gather(ref_histogram,ref_grid->mpi);
    if (uVar2 == 0) {
      for (lVar5 = 0; lVar5 < local_40->n; lVar5 = lVar5 + 1) {
        uVar2 = ref_edge_part(local_40,(REF_INT)lVar5,&local_44);
        if (uVar2 != 0) {
          pcVar4 = "edge part";
          uVar3 = 0x199;
          goto LAB_0017bff3;
        }
        if (local_44 == ref_grid->mpi->id) {
          uVar2 = ref_node_ratio(ref_grid->node,local_40->e2n[lVar5 * 2],
                                 local_40->e2n[lVar5 * 2 + 1],&local_38);
          if (uVar2 != 0) {
            pcVar4 = "rat";
            uVar3 = 0x19e;
            goto LAB_0017bff3;
          }
          uVar2 = ref_histogram_add_stat(ref_histogram,local_38);
          if (uVar2 != 0) {
            pcVar4 = "add";
            uVar3 = 0x19f;
            goto LAB_0017bff3;
          }
        }
      }
      uVar2 = ref_histogram_gather_stat(ref_histogram,ref_grid->mpi);
      if (uVar2 == 0) {
        uVar2 = ref_edge_free(local_40);
        if (uVar2 == 0) {
          return 0;
        }
        pcVar4 = "free edge";
        uVar3 = 0x1a5;
      }
      else {
        pcVar4 = "gather";
        uVar3 = 0x1a3;
      }
    }
    else {
      pcVar4 = "gather";
      uVar3 = 0x196;
    }
  }
  else {
    pcVar4 = "make edges";
    uVar3 = 0x181;
  }
LAB_0017bff3:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c",uVar3
         ,"ref_histogram_add_ratio",(ulong)uVar2,pcVar4);
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_histogram_add_ratio(REF_HISTOGRAM ref_histogram,
                                           REF_GRID ref_grid) {
  REF_EDGE ref_edge;
  REF_INT edge, part;
  REF_DBL ratio;

  RSS(ref_edge_create(&ref_edge, ref_grid), "make edges");

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    RSS(ref_edge_part(ref_edge, edge, &part), "edge part");
    if (part == ref_mpi_rank(ref_grid_mpi(ref_grid))) {
      RSS(ref_node_ratio(ref_grid_node(ref_grid),
                         ref_edge_e2n(ref_edge, 0, edge),
                         ref_edge_e2n(ref_edge, 1, edge), &ratio),
          "rat");
      RSB(ref_histogram_add(ref_histogram, ratio), "add", {
        printf("ratio %e at %f %f %f\n", ratio,
               ref_node_xyz(ref_grid_node(ref_grid), 0,
                            ref_edge_e2n(ref_edge, 0, edge)),
               ref_node_xyz(ref_grid_node(ref_grid), 1,
                            ref_edge_e2n(ref_edge, 0, edge)),
               ref_node_xyz(ref_grid_node(ref_grid), 2,
                            ref_edge_e2n(ref_edge, 0, edge)));
      });
    }
  }

  RSS(ref_histogram_gather(ref_histogram, ref_grid_mpi(ref_grid)), "gather");

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    RSS(ref_edge_part(ref_edge, edge, &part), "edge part");
    if (part == ref_mpi_rank(ref_grid_mpi(ref_grid))) {
      RSS(ref_node_ratio(ref_grid_node(ref_grid),
                         ref_edge_e2n(ref_edge, 0, edge),
                         ref_edge_e2n(ref_edge, 1, edge), &ratio),
          "rat");
      RSS(ref_histogram_add_stat(ref_histogram, ratio), "add");
    }
  }
  RSS(ref_histogram_gather_stat(ref_histogram, ref_grid_mpi(ref_grid)),
      "gather");

  RSS(ref_edge_free(ref_edge), "free edge");

  return REF_SUCCESS;
}